

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::fresnel::unpolarized::eval(unpolarized *this,float_t zd)

{
  bool bVar1;
  size_t sVar2;
  float *pfVar3;
  float *extraout_RDX;
  long in_RSI;
  float_t fVar4;
  value_type vVar5;
  int local_24;
  int i;
  float_t zd_local;
  unpolarized *this_local;
  value_type *F;
  
  bVar1 = false;
  if ((0.0 <= zd) && (bVar1 = false, zd <= 1.0)) {
    bVar1 = true;
  }
  if (bVar1) {
    sVar2 = std::valarray<float>::size((valarray<float> *)(in_RSI + 8));
    std::valarray<float>::valarray((valarray<float> *)this,sVar2);
    for (local_24 = 0; sVar2 = std::valarray<float>::size((valarray<float> *)(in_RSI + 8)),
        local_24 < (int)sVar2; local_24 = local_24 + 1) {
      pfVar3 = std::valarray<float>::operator[]((valarray<float> *)(in_RSI + 8),(long)local_24);
      fVar4 = unpolarized__eval(zd,*pfVar3);
      pfVar3 = std::valarray<float>::operator[]((valarray<float> *)this,(long)local_24);
      *pfVar3 = fVar4;
    }
    vVar5._M_data = extraout_RDX;
    vVar5._M_size = (size_t)this;
    return vVar5;
  }
  __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                ,0x474,"virtual brdf::value_type djb::fresnel::unpolarized::eval(float_t) const");
}

Assistant:

brdf::value_type unpolarized::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	brdf::value_type F(ior.size());

	for (int i = 0; i < (int)ior.size(); ++i)
		F[i] = unpolarized__eval(zd, ior[i]);

	return F;
}